

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipFieldValue(ParserImpl *this)

{
  bool bVar1;
  int iVar2;
  Token *pTVar3;
  AlphaNum *in_R8;
  byte local_291;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  undefined1 local_228 [8];
  string text_1;
  undefined1 local_1e8 [8];
  string text;
  string local_1c0;
  byte local_19a;
  allocator local_199;
  undefined1 local_198 [6];
  bool has_minus;
  allocator local_171;
  string local_170;
  byte local_14b;
  byte local_14a;
  allocator local_149;
  string local_148;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  AlphaNum local_c8;
  AlphaNum local_98;
  AlphaNum local_68;
  string local_38;
  ParserImpl *local_18;
  ParserImpl *this_local;
  
  iVar2 = this->recursion_limit_ + -1;
  this->recursion_limit_ = iVar2;
  local_18 = this;
  if (iVar2 < 0) {
    strings::AlphaNum::AlphaNum
              (&local_68,
               "Message is too deep, the parser exceeded the configured recursion limit of ");
    strings::AlphaNum::AlphaNum(&local_98,this->initial_recursion_limit_);
    strings::AlphaNum::AlphaNum(&local_c8,".");
    StrCat_abi_cxx11_(&local_38,(protobuf *)&local_68,&local_98,&local_c8,in_R8);
    ReportError(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    this_local._7_1_ = 0;
  }
  else {
    bVar1 = LookingAtType(this,TYPE_STRING);
    if (bVar1) {
      while (bVar1 = LookingAtType(this,TYPE_STRING), bVar1) {
        io::Tokenizer::Next(&this->tokenizer_);
      }
      this->recursion_limit_ = this->recursion_limit_ + 1;
      this_local._7_1_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f8,"[",&local_f9);
      bVar1 = TryConsume(this,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      if (bVar1) {
        do {
          std::allocator<char>::allocator();
          local_14a = 0;
          local_14b = 0;
          std::__cxx11::string::string((string *)&local_120,"{",&local_121);
          bVar1 = LookingAt(this,&local_120);
          local_291 = 0;
          if (!bVar1) {
            std::allocator<char>::allocator();
            local_14a = 1;
            std::__cxx11::string::string((string *)&local_148,"<",&local_149);
            local_14b = 1;
            bVar1 = LookingAt(this,&local_148);
            local_291 = bVar1 ^ 0xff;
          }
          if ((local_14b & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_148);
          }
          if ((local_14a & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&local_149);
          }
          std::__cxx11::string::~string((string *)&local_120);
          std::allocator<char>::~allocator((allocator<char> *)&local_121);
          if ((local_291 & 1) == 0) {
            bVar1 = SkipFieldMessage(this);
            if (!bVar1) {
              this_local._7_1_ = 0;
              goto LAB_00726f75;
            }
          }
          else {
            bVar1 = SkipFieldValue(this);
            if (!bVar1) {
              this_local._7_1_ = 0;
              goto LAB_00726f75;
            }
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_170,"]",&local_171);
          bVar1 = TryConsume(this,&local_170);
          std::__cxx11::string::~string((string *)&local_170);
          std::allocator<char>::~allocator((allocator<char> *)&local_171);
          if (bVar1) {
            this->recursion_limit_ = this->recursion_limit_ + 1;
            this_local._7_1_ = 1;
            goto LAB_00726f75;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)local_198,",",&local_199);
          bVar1 = Consume(this,(string *)local_198);
          std::__cxx11::string::~string((string *)local_198);
          std::allocator<char>::~allocator((allocator<char> *)&local_199);
        } while (bVar1);
        this_local._7_1_ = 0;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1c0,"-",(allocator *)(text.field_2._M_local_buf + 0xf));
        bVar1 = TryConsume(this,&local_1c0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::allocator<char>::~allocator((allocator<char> *)(text.field_2._M_local_buf + 0xf));
        local_19a = bVar1;
        bVar1 = LookingAtType(this,TYPE_INTEGER);
        if (((bVar1) || (bVar1 = LookingAtType(this,TYPE_FLOAT), bVar1)) ||
           (bVar1 = LookingAtType(this,TYPE_IDENTIFIER), bVar1)) {
          if (((local_19a & 1) != 0) && (bVar1 = LookingAtType(this,TYPE_IDENTIFIER), bVar1)) {
            pTVar3 = io::Tokenizer::current(&this->tokenizer_);
            std::__cxx11::string::string((string *)local_228,(string *)&pTVar3->text);
            LowerString((string *)local_228);
            bVar1 = std::operator!=((string *)local_228,"inf");
            if ((bVar1) &&
               ((bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_228,"infinity"), bVar1 &&
                (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_228,"nan"), bVar1)))) {
              std::operator+(&local_248,"Invalid float number: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_228);
              ReportError(this,&local_248);
              std::__cxx11::string::~string((string *)&local_248);
              this->recursion_limit_ = this->recursion_limit_ + 1;
              this_local._7_1_ = 0;
              bVar1 = true;
            }
            else {
              bVar1 = false;
            }
            std::__cxx11::string::~string((string *)local_228);
            if (bVar1) goto LAB_00726f75;
          }
          io::Tokenizer::Next(&this->tokenizer_);
          this->recursion_limit_ = this->recursion_limit_ + 1;
          this_local._7_1_ = 1;
        }
        else {
          pTVar3 = io::Tokenizer::current(&this->tokenizer_);
          std::__cxx11::string::string((string *)local_1e8,(string *)&pTVar3->text);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&text_1.field_2 + 8),"Cannot skip field value, unexpected token: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1e8);
          ReportError(this,(string *)((long)&text_1.field_2 + 8));
          std::__cxx11::string::~string((string *)(text_1.field_2._M_local_buf + 8));
          this->recursion_limit_ = this->recursion_limit_ + 1;
          this_local._7_1_ = 0;
          std::__cxx11::string::~string((string *)local_1e8);
        }
      }
    }
  }
LAB_00726f75:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool SkipFieldValue() {
    if (--recursion_limit_ < 0) {
      ReportError(
          StrCat("Message is too deep, the parser exceeded the "
                       "configured recursion limit of ",
                       initial_recursion_limit_, "."));
      return false;
    }

    if (LookingAtType(io::Tokenizer::TYPE_STRING)) {
      while (LookingAtType(io::Tokenizer::TYPE_STRING)) {
        tokenizer_.Next();
      }
      ++recursion_limit_;
      return true;
    }
    if (TryConsume("[")) {
      while (true) {
        if (!LookingAt("{") && !LookingAt("<")) {
          DO(SkipFieldValue());
        } else {
          DO(SkipFieldMessage());
        }
        if (TryConsume("]")) {
          break;
        }
        DO(Consume(","));
      }
      ++recursion_limit_;
      return true;
    }
    // Possible field values other than string:
    //   12345        => TYPE_INTEGER
    //   -12345       => TYPE_SYMBOL + TYPE_INTEGER
    //   1.2345       => TYPE_FLOAT
    //   -1.2345      => TYPE_SYMBOL + TYPE_FLOAT
    //   inf          => TYPE_IDENTIFIER
    //   -inf         => TYPE_SYMBOL + TYPE_IDENTIFIER
    //   TYPE_INTEGER => TYPE_IDENTIFIER
    // Divides them into two group, one with TYPE_SYMBOL
    // and the other without:
    //   Group one:
    //     12345        => TYPE_INTEGER
    //     1.2345       => TYPE_FLOAT
    //     inf          => TYPE_IDENTIFIER
    //     TYPE_INTEGER => TYPE_IDENTIFIER
    //   Group two:
    //     -12345       => TYPE_SYMBOL + TYPE_INTEGER
    //     -1.2345      => TYPE_SYMBOL + TYPE_FLOAT
    //     -inf         => TYPE_SYMBOL + TYPE_IDENTIFIER
    // As we can see, the field value consists of an optional '-' and one of
    // TYPE_INTEGER, TYPE_FLOAT and TYPE_IDENTIFIER.
    bool has_minus = TryConsume("-");
    if (!LookingAtType(io::Tokenizer::TYPE_INTEGER) &&
        !LookingAtType(io::Tokenizer::TYPE_FLOAT) &&
        !LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      std::string text = tokenizer_.current().text;
      ReportError("Cannot skip field value, unexpected token: " + text);
      ++recursion_limit_;
      return false;
    }
    // Combination of '-' and TYPE_IDENTIFIER may result in an invalid field
    // value while other combinations all generate valid values.
    // We check if the value of this combination is valid here.
    // TYPE_IDENTIFIER after a '-' should be one of the float values listed
    // below:
    //   inf, inff, infinity, nan
    if (has_minus && LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      std::string text = tokenizer_.current().text;
      LowerString(&text);
      if (text != "inf" &&
          text != "infinity" && text != "nan") {
        ReportError("Invalid float number: " + text);
        ++recursion_limit_;
        return false;
      }
    }
    tokenizer_.Next();
    ++recursion_limit_;
    return true;
  }